

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::EntryDefineProperties(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *object;
  RecyclableObject *aValue;
  int in_stack_00000010;
  uint local_50;
  undefined4 uStack_4c;
  Type TStack_48;
  CallInfo local_40;
  CallInfo callInfo_local;
  RecyclableObject *properties;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x555,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b92a72;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&properties,&local_40,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x55a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b92a72:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((uint)properties & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&properties,1);
    BVar4 = JavascriptOperators::IsObject(pvVar7);
    if (BVar4 != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&properties,1);
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar7);
      pvVar7 = Arguments::operator[]((Arguments *)&properties,1);
      object = VarTo<Js::RecyclableObject>(pvVar7);
      if (((object->type).ptr)->typeId == TypeIds_HostDispatch) {
        local_50 = (uint)properties;
        uStack_4c = properties._4_4_;
        TStack_48._0_4_ = args.super_Arguments.Info._0_4_;
        TStack_48._4_4_ = args.super_Arguments.Info._4_4_;
        iVar5 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(object,EntryDefineProperties,&local_50,0);
        if (iVar5 != 0) {
          return object;
        }
      }
      if (((uint)properties & 0xffffff) < 3) {
        aValue = (((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 undefinedValue.ptr;
      }
      else {
        aValue = (RecyclableObject *)Arguments::operator[]((Arguments *)&properties,2);
      }
      callInfo_local = (CallInfo)0x0;
      BVar4 = JavascriptConversion::ToObject(aValue,pSVar1,(RecyclableObject **)&callInfo_local);
      if (BVar4 != 0) {
        DefinePropertiesHelper(object,(RecyclableObject *)callInfo_local,pSVar1);
        return object;
      }
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec32,L"Object.defineProperties");
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"Object.defineProperties");
}

Assistant:

Var JavascriptObject::EntryDefineProperties(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_defineProperties);

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Object.defineProperties"));
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
    RecyclableObject *object = VarTo<RecyclableObject>(args[1]);

    // If the object is HostDispatch try to invoke the operation remotely
    if (object->GetTypeId() == TypeIds_HostDispatch)
    {
        if (object->InvokeBuiltInOperationRemotely(EntryDefineProperties, args, NULL))
        {
            return object;
        }
    }

    Var propertiesVar = args.Info.Count > 2 ? args[2] : object->GetLibrary()->GetUndefined();
    RecyclableObject* properties = nullptr;
    if (FALSE == JavascriptConversion::ToObject(propertiesVar, scriptContext, &properties))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NullOrUndefined, _u("Object.defineProperties"));
    }

    return DefinePropertiesHelper(object, properties, scriptContext);
}